

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::BW_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  ulong uVar1;
  ulong uVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  byte bVar5;
  SQInteger i2;
  SQInteger i1;
  SQInteger res;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQObjectPtr *trg_local;
  SQUnsignedInteger op_local;
  SQVM *this_local;
  
  if (((o1->super_SQObject)._type | (o2->super_SQObject)._type) == OT_INTEGER) {
    uVar1 = (o1->super_SQObject)._unVal.nInteger;
    uVar2 = (o2->super_SQObject)._unVal.nInteger;
    bVar5 = (byte)uVar2;
    switch(op) {
    case 0:
      i1 = uVar1 & uVar2;
      break;
    default:
      Raise_Error(this,"internal vm error bitwise op failed");
      return false;
    case 2:
      i1 = uVar1 | uVar2;
      break;
    case 3:
      i1 = uVar1 ^ uVar2;
      break;
    case 4:
      i1 = uVar1 << (bVar5 & 0x3f);
      break;
    case 5:
      i1 = (long)uVar1 >> (bVar5 & 0x3f);
      break;
    case 6:
      i1 = uVar1 >> (bVar5 & 0x3f);
    }
    ::SQObjectPtr::operator=(trg,i1);
    this_local._7_1_ = true;
  }
  else {
    pSVar3 = GetTypeName(o1);
    pSVar4 = GetTypeName(o2);
    Raise_Error(this,"bitwise op between \'%s\' and \'%s\'",pSVar3,pSVar4);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::BW_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger res;
    if((sq_type(o1)| sq_type(o2)) == OT_INTEGER)
    {
        SQInteger i1 = _integer(o1), i2 = _integer(o2);
        switch(op) {
            case BW_AND:    res = i1 & i2; break;
            case BW_OR:     res = i1 | i2; break;
            case BW_XOR:    res = i1 ^ i2; break;
            case BW_SHIFTL: res = i1 << i2; break;
            case BW_SHIFTR: res = i1 >> i2; break;
            case BW_USHIFTR:res = (SQInteger)(*((SQUnsignedInteger*)&i1) >> i2); break;
            default: { Raise_Error(_SC("internal vm error bitwise op failed")); return false; }
        }
    }
    else { Raise_Error(_SC("bitwise op between '%s' and '%s'"),GetTypeName(o1),GetTypeName(o2)); return false;}
    trg = res;
    return true;
}